

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexInputTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::VertexInputTest::getGlslVertexCheck_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  undefined1 local_1d0 [4];
  int vertexInputCount;
  ulong local_1b0;
  size_t attributeNdx;
  int local_194;
  ostringstream local_190 [4];
  int totalInputComponentCount;
  ostringstream glslCode;
  VertexInputTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_194 = 0;
  std::operator<<((ostream *)local_190,"\tint okCount = 0;\n");
  local_1b0 = 0;
  while( true ) {
    uVar2 = local_1b0;
    sVar3 = std::
            vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
            ::size((vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                    *)((long)this + 0x70));
    if (sVar3 <= uVar2) break;
    pvVar4 = std::
             vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
             ::operator[]((vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                           *)((long)this + 0x70),local_1b0);
    getGlslAttributeConditions_abi_cxx11_((string *)local_1d0,this,pvVar4,(deUint32)local_1b0);
    std::operator<<((ostream *)local_190,(string *)local_1d0);
    std::__cxx11::string::~string((string *)local_1d0);
    pvVar4 = std::
             vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
             ::operator[]((vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                           *)((long)this + 0x70),local_1b0);
    iVar1 = *(int *)(s_glslTypeDescriptions + (ulong)pvVar4->glslType * 0x18 + 0xc);
    pvVar4 = std::
             vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
             ::operator[]((vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                           *)((long)this + 0x70),local_1b0);
    local_194 = iVar1 * *(int *)(s_glslTypeDescriptions + (ulong)pvVar4->glslType * 0x18 + 8) +
                local_194;
    local_1b0 = local_1b0 + 1;
  }
  poVar5 = std::operator<<((ostream *)local_190,"\tif (okCount == ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_194);
  poVar5 = std::operator<<(poVar5,
                           ")\n\t{\n\t\tif (gl_InstanceIndex == 0)\n\t\t\tvtxColor = vec4(1.0, 0.0, 0.0, 1.0);\n\t\telse\n\t\t\tvtxColor = vec4(0.0, 0.0, 1.0, 1.0);\n\t}\n\telse\n\t{\n\t\tvtxColor = vec4(okCount / float("
                          );
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_194);
  poVar5 = std::operator<<(poVar5,"), 0.0f, 0.0f, 1.0);\n");
  std::operator<<(poVar5,
                  "\t}\n\n\tif (gl_InstanceIndex == 0)\n\t{\n\t\tif (gl_VertexIndex == 0) gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n\t\telse if (gl_VertexIndex == 1) gl_Position = vec4(0.0, -1.0, 0.0, 1.0);\n\t\telse if (gl_VertexIndex == 2) gl_Position = vec4(-1.0, 1.0, 0.0, 1.0);\n\t\telse if (gl_VertexIndex == 3) gl_Position = vec4(0.0, 1.0, 0.0, 1.0);\n\t\telse gl_Position = vec4(0.0);\n\t}\n\telse\n\t{\n\t\tif (gl_VertexIndex == 0) gl_Position = vec4(0.0, -1.0, 0.0, 1.0);\n\t\telse if (gl_VertexIndex == 1) gl_Position = vec4(1.0, -1.0, 0.0, 1.0);\n\t\telse if (gl_VertexIndex == 2) gl_Position = vec4(0.0, 1.0, 0.0, 1.0);\n\t\telse if (gl_VertexIndex == 3) gl_Position = vec4(1.0, 1.0, 0.0, 1.0);\n\t\telse gl_Position = vec4(0.0);\n\t}\n"
                 );
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string VertexInputTest::getGlslVertexCheck (void) const
{
	std::ostringstream	glslCode;
	int					totalInputComponentCount	= 0;


	glslCode << "	int okCount = 0;\n";

	for (size_t attributeNdx = 0; attributeNdx < m_attributeInfos.size(); attributeNdx++)
	{
		glslCode << getGlslAttributeConditions(m_attributeInfos[attributeNdx], (deUint32)attributeNdx);

		const int vertexInputCount	= VertexInputTest::s_glslTypeDescriptions[m_attributeInfos[attributeNdx].glslType].vertexInputCount;
		totalInputComponentCount	+= vertexInputCount * VertexInputTest::s_glslTypeDescriptions[m_attributeInfos[attributeNdx].glslType].vertexInputComponentCount;
	}

	glslCode <<
		"	if (okCount == " << totalInputComponentCount << ")\n"
		"	{\n"
		"		if (gl_InstanceIndex == 0)\n"
		"			vtxColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
		"		else\n"
		"			vtxColor = vec4(0.0, 0.0, 1.0, 1.0);\n"
		"	}\n"
		"	else\n"
		"	{\n"
		"		vtxColor = vec4(okCount / float(" << totalInputComponentCount << "), 0.0f, 0.0f, 1.0);\n" <<
		"	}\n\n"
		"	if (gl_InstanceIndex == 0)\n"
		"	{\n"
		"		if (gl_VertexIndex == 0) gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
		"		else if (gl_VertexIndex == 1) gl_Position = vec4(0.0, -1.0, 0.0, 1.0);\n"
		"		else if (gl_VertexIndex == 2) gl_Position = vec4(-1.0, 1.0, 0.0, 1.0);\n"
		"		else if (gl_VertexIndex == 3) gl_Position = vec4(0.0, 1.0, 0.0, 1.0);\n"
		"		else gl_Position = vec4(0.0);\n"
		"	}\n"
		"	else\n"
		"	{\n"
		"		if (gl_VertexIndex == 0) gl_Position = vec4(0.0, -1.0, 0.0, 1.0);\n"
		"		else if (gl_VertexIndex == 1) gl_Position = vec4(1.0, -1.0, 0.0, 1.0);\n"
		"		else if (gl_VertexIndex == 2) gl_Position = vec4(0.0, 1.0, 0.0, 1.0);\n"
		"		else if (gl_VertexIndex == 3) gl_Position = vec4(1.0, 1.0, 0.0, 1.0);\n"
		"		else gl_Position = vec4(0.0);\n"
		"	}\n";

	return glslCode.str();
}